

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall
FOptionMenuItemControl::MenuEvent(FOptionMenuItemControl *this,int mkey,bool fromcontroller)

{
  uint key;
  FKeyBindings *pFVar1;
  char *pcVar2;
  bool fromcontroller_local;
  int mkey_local;
  FOptionMenuItemControl *this_local;
  
  if (mkey == 10) {
    this->mWaiting = false;
    pFVar1 = this->mBindings;
    key = this->mInput;
    pcVar2 = FName::operator_cast_to_char_
                       (&(this->super_FOptionMenuItem).super_FListMenuItem.mAction);
    FKeyBindings::SetBind(pFVar1,key,pcVar2);
    this_local._7_1_ = true;
  }
  else if (mkey == 8) {
    pFVar1 = this->mBindings;
    pcVar2 = FName::operator_cast_to_char_
                       (&(this->super_FOptionMenuItem).super_FListMenuItem.mAction);
    FKeyBindings::UnbindACommand(pFVar1,pcVar2);
    this_local._7_1_ = true;
  }
  else if (mkey == 0xb) {
    this->mWaiting = false;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MenuEvent(int mkey, bool fromcontroller)
	{
		if (mkey == MKEY_Input)
		{
			mWaiting = false;
			mBindings->SetBind(mInput, mAction);
			return true;
		}
		else if (mkey == MKEY_Clear)
		{
			mBindings->UnbindACommand(mAction);
			return true;
		}
		else if (mkey == MKEY_Abort)
		{
			mWaiting = false;
			return true;
		}
		return false;
	}